

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  ulong *puVar3;
  __m128i *palVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  long lVar15;
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  parasail_result_t *ppVar21;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  ulong uVar22;
  int iVar23;
  int iVar24;
  size_t len;
  size_t len_00;
  long lVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  longlong lVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  longlong lVar44;
  undefined1 auVar45 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar46 [16];
  ulong uVar52;
  undefined1 auVar47 [16];
  long lVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong uVar54;
  longlong lVar55;
  __m128i_64_t B;
  ulong uVar59;
  long lVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  long lVar61;
  longlong lVar62;
  long lVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar69;
  __m128i_64_t B_6;
  ulong uVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int64_t iVar74;
  __m128i_64_t B_3;
  undefined1 auVar76 [16];
  ulong uVar75;
  undefined1 auVar77 [16];
  __m128i_64_t B_1;
  undefined1 auVar78 [16];
  __m128i_64_t B_5;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i_64_t B_2;
  undefined1 auVar90 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_64_t h;
  ulong local_2c8;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  long local_218;
  long lStack_210;
  undefined1 local_208 [16];
  int local_1c0;
  undefined1 local_1a8 [16];
  long lStack_190;
  long local_188;
  long lStack_180;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  ulong uStack_b0;
  long local_88;
  ulong uStack_80;
  longlong local_48 [3];
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar7 = (profile->profile64).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar6 = profile->s1Len;
        if ((int)uVar6 < 1) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar31 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            iVar30 = uVar6 - 1;
            uVar29 = (ulong)uVar6 + 1;
            uVar38 = uVar29 >> 1;
            uVar37 = (uint)uVar38;
            iVar17 = iVar30 / (int)uVar37;
            uVar27 = iVar30 % (int)uVar37;
            local_208._0_4_ = uVar27;
            pvVar9 = (profile->profile64).matches;
            pvVar10 = (profile->profile64).similar;
            iVar23 = -open;
            iVar39 = ppVar8->min;
            local_248._0_4_ = iVar23;
            uVar40 = 0x8000000000000000 - (long)iVar39;
            if (iVar39 != iVar23 && SBORROW4(iVar39,iVar23) == iVar39 + open < 0) {
              uVar40 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar39 = ppVar8->max;
            ppVar21 = parasail_result_new_table3((uint)uVar29 & 0x7ffffffe,s2Len);
            if (ppVar21 != (parasail_result_t *)0x0) {
              ppVar21->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x2830402;
              b = parasail_memalign___m128i(0x10,uVar38);
              b_00 = parasail_memalign___m128i(0x10,uVar38);
              b_01 = parasail_memalign___m128i(0x10,uVar38);
              b_02 = parasail_memalign___m128i(0x10,uVar38);
              ptr = parasail_memalign___m128i(0x10,uVar38);
              b_03 = parasail_memalign___m128i(0x10,uVar38);
              b_04 = parasail_memalign___m128i(0x10,uVar38);
              b_05 = parasail_memalign___m128i(0x10,uVar38);
              ptr_00 = parasail_memalign___m128i(0x10,uVar38);
              ptr_01 = parasail_memalign___m128i(0x10,uVar38);
              ptr_02 = parasail_memalign___m128i(0x10,uVar38);
              ptr_03 = parasail_memalign___m128i(0x10,uVar38);
              ptr_04 = parasail_memalign___m128i(0x10,uVar38);
              ptr_05 = parasail_memalign___m128i(0x10,uVar38);
              ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (ptr_02 == (__m128i *)0x0 ||
                           (ptr_01 == (__m128i *)0x0 ||
                           (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0))) ||
                           ((b_04 == (__m128i *)0x0 ||
                            (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                           ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                           (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
              if ((ptr_06 != (int64_t *)0x0 &&
                  (ptr_05 != (__m128i *)0x0 &&
                  (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))) &&
                  ((ptr_02 != (__m128i *)0x0 &&
                   (ptr_01 != (__m128i *)0x0 && (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0)
                   )) && ((b_04 != (__m128i *)0x0 &&
                          (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) &&
                         ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                         (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
                iVar18 = s2Len + -1;
                iVar19 = 1 - iVar17;
                uVar41 = (ulong)(uint)gap;
                uVar1 = uVar40 + 1;
                len = 0x7ffffffffffffffe - (long)iVar39;
                auVar45._8_4_ = (int)uVar1;
                auVar45._0_8_ = uVar1;
                auVar45._12_4_ = (int)(uVar1 >> 0x20);
                local_c8._8_4_ = (int)len;
                local_c8._0_8_ = len;
                local_c8._12_4_ = (int)(len >> 0x20);
                auVar88._0_8_ = (long)iVar19;
                auVar88._8_4_ = iVar19;
                auVar88._12_4_ = iVar19 >> 0x1f;
                c[0] = uVar38;
                len_00 = len;
                parasail_memset___m128i(b_03,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar38;
                parasail_memset___m128i(b_04,c_00,len_00);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar38;
                parasail_memset___m128i(b_05,c_01,len_00);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar38;
                parasail_memset___m128i(b,c_02,len_00);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar38;
                parasail_memset___m128i(b_00,c_03,len_00);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar38;
                parasail_memset___m128i(b_01,c_04,len_00);
                c_05[1] = extraout_RDX_05;
                c_05[0] = uVar38;
                parasail_memset___m128i(b_02,c_05,len_00);
                uStack_b0 = (ulong)(uint)gap;
                lVar61 = -(ulong)(uint)open;
                lVar68 = -(ulong)(uint)open;
                uVar20 = uVar37 - 1;
                lVar25 = (ulong)uVar20 << 4;
                auVar46 = pmovsxbq(extraout_XMM0,0x101);
                auVar71._8_4_ = 0xffffffff;
                auVar71._0_8_ = 0xffffffffffffffff;
                auVar71._12_4_ = 0xffffffff;
                uVar33 = uVar38;
                do {
                  plVar2 = (long *)((long)*ptr_04 + lVar25);
                  *plVar2 = lVar61;
                  plVar2[1] = lVar68;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar25) = auVar46;
                  lVar61 = lVar61 - uVar41;
                  lVar68 = lVar68 - uStack_b0;
                  lVar53 = auVar46._8_8_;
                  auVar46._0_8_ = auVar46._0_8_ + 1;
                  auVar46._8_8_ = lVar53 - auVar71._8_8_;
                  lVar25 = lVar25 + -0x10;
                  iVar39 = (int)uVar33;
                  uVar28 = iVar39 - 1;
                  uVar33 = (ulong)uVar28;
                } while (uVar28 != 0 && 0 < iVar39);
                lVar61 = (long)iVar23;
                uVar33 = 0;
                do {
                  lVar25 = 0;
                  lVar68 = lVar61;
                  do {
                    lVar35 = lVar68;
                    if (s1_beg != 0) {
                      lVar35 = 0;
                    }
                    local_48[lVar25] = lVar35;
                    lVar25 = lVar25 + 1;
                    lVar68 = lVar68 - uVar38 * (uint)gap;
                  } while (lVar25 == 1);
                  ptr[uVar33][0] = local_48[0];
                  ptr[uVar33][1] = local_48[1];
                  uVar33 = uVar33 + 1;
                  lVar61 = lVar61 - (ulong)(uint)gap;
                } while (uVar33 != uVar38);
                *ptr_06 = 0;
                uVar33 = 1;
                do {
                  iVar39 = 0;
                  if (s2_beg == 0) {
                    iVar39 = iVar23;
                  }
                  ptr_06[uVar33] = (long)iVar39;
                  uVar33 = uVar33 + 1;
                  iVar23 = iVar23 - gap;
                } while (s2Len + 1 != uVar33);
                palVar4 = ptr + uVar20;
                uVar33 = 1;
                if (1 < s2Len) {
                  uVar33 = uVar31;
                }
                lVar61 = (ulong)(uVar37 + (uVar37 == 0)) << 4;
                lVar25 = uVar38 * uVar31 * 4;
                lVar68 = 0;
                local_1a8._8_8_ = auVar88._8_8_;
                local_1a8._8_8_ = -(ulong)(local_1a8._8_8_ == 0);
                local_1a8._0_8_ = -(ulong)(auVar88._0_8_ == 1);
                uVar38 = 0;
                auVar66 = auVar45;
                auVar72 = auVar45;
                auVar77 = auVar45;
                auVar78 = auVar45;
                iVar39 = iVar18;
                local_d8 = auVar45;
                do {
                  lStack_210 = b_04[uVar20][0];
                  lStack_180 = b_05[uVar20][0];
                  auVar76._8_4_ = (int)(*palVar4)[0];
                  auVar76._0_8_ = (*palVar4)[0];
                  auVar76._12_4_ = *(undefined4 *)((long)*palVar4 + 4);
                  local_218 = 0;
                  local_188 = 0;
                  lVar26 = (long)(int)uVar37 * (long)ppVar8->mapper[(byte)s2[uVar38]] * 0x10;
                  lStack_190 = auVar45._8_8_;
                  uVar54 = uVar1 - (*ptr_04)[0];
                  uVar59 = lStack_190 - (*ptr_04)[1];
                  auVar46 = (undefined1  [16])0x0;
                  lVar34 = 0;
                  local_228 = (undefined1  [16])0x0;
                  local_238 = (undefined1  [16])0x0;
                  auVar88 = local_208;
                  uVar75 = uVar1;
                  iVar74 = ptr_06[uVar38];
                  lVar53 = auVar76._8_8_;
                  local_208._0_8_ = 0;
                  local_208._8_8_ = b_03[uVar20][0];
                  do {
                    plVar2 = (long *)((long)*ptr + lVar34);
                    lVar12 = *plVar2;
                    lVar15 = plVar2[1];
                    auVar71 = *(undefined1 (*) [16])((long)*b_03 + lVar34);
                    plVar2 = (long *)((long)*b + lVar34);
                    uVar69 = lVar12 - (ulong)(uint)open;
                    uVar73 = lVar15 - (ulong)(uint)open;
                    uVar42 = *plVar2 - uVar41;
                    uVar52 = plVar2[1] - (ulong)(uint)gap;
                    uVar43 = uVar52;
                    if ((long)uVar52 < (long)uVar73) {
                      uVar43 = uVar73;
                    }
                    uVar22 = uVar42;
                    if ((long)uVar42 < (long)uVar69) {
                      uVar22 = uVar69;
                    }
                    auVar81._8_8_ = -(ulong)((long)uVar52 < (long)uVar73);
                    auVar81._0_8_ = -(ulong)((long)uVar42 < (long)uVar69);
                    auVar79 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar34),auVar71,auVar81)
                    ;
                    auVar76 = *(undefined1 (*) [16])((long)*b_04 + lVar34);
                    auVar70 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar34),auVar76,auVar81)
                    ;
                    auVar5 = *(undefined1 (*) [16])((long)*b_05 + lVar34);
                    auVar81 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar34),auVar5,auVar81);
                    plVar2 = (long *)((long)*ptr_04 + lVar34);
                    uVar54 = uVar54 + *plVar2;
                    lVar60 = uVar59 + plVar2[1];
                    lVar36 = lVar60;
                    if (lVar60 < lStack_190) {
                      lVar36 = lStack_190;
                    }
                    uVar42 = uVar54;
                    if ((long)uVar54 < (long)uVar75) {
                      uVar42 = uVar75;
                    }
                    auVar80._8_8_ = -(ulong)(lVar60 < lStack_190);
                    auVar80._0_8_ = -(ulong)((long)uVar54 < (long)uVar75);
                    auVar56._0_8_ = -(ulong)(uVar54 == uVar75);
                    auVar56._8_8_ = -(ulong)(lVar60 == lStack_190);
                    auVar56 = auVar56 | auVar80;
                    local_238 = pblendvb(auVar88,local_238,auVar56);
                    local_228 = pblendvb(local_248,local_228,auVar56);
                    plVar2 = (long *)((long)*ptr_05 + lVar34);
                    auVar83._0_8_ = in_XMM10._0_8_ + *plVar2;
                    auVar83._8_8_ = in_XMM10._8_8_ + plVar2[1];
                    auVar46 = pblendvb(auVar83,auVar46,auVar56);
                    plVar2 = (long *)((long)pvVar7 + lVar34 + lVar26);
                    uVar75 = iVar74 + *plVar2;
                    uVar52 = lVar53 + plVar2[1];
                    uVar59 = uVar43;
                    if ((long)uVar43 <= (long)uVar52) {
                      uVar59 = uVar52;
                    }
                    uVar54 = uVar22;
                    if ((long)uVar22 <= (long)uVar75) {
                      uVar54 = uVar75;
                    }
                    auVar47._8_8_ = -(ulong)((long)uVar52 < (long)uVar43);
                    auVar47._0_8_ = -(ulong)((long)uVar75 < (long)uVar22);
                    plVar2 = (long *)((long)pvVar9 + lVar34 + lVar26);
                    auVar85._0_8_ = local_208._0_8_ + *plVar2;
                    auVar85._8_8_ = local_208._8_8_ + plVar2[1];
                    auVar88 = pblendvb(auVar85,auVar79,auVar47);
                    plVar2 = (long *)((long)pvVar10 + lVar34 + lVar26);
                    auVar90._0_8_ = local_218 + *plVar2;
                    auVar90._8_8_ = lStack_210 + plVar2[1];
                    local_248 = pblendvb(auVar90,auVar70,auVar47);
                    auVar84._8_4_ = 0xffffffff;
                    auVar84._0_8_ = 0xffffffffffffffff;
                    auVar84._12_4_ = 0xffffffff;
                    auVar82._0_8_ = auVar81._0_8_ + 1;
                    auVar82._8_8_ = auVar81._8_8_ - auVar84._8_8_;
                    auVar63._0_8_ = local_188 + 1;
                    auVar63._8_8_ = lStack_180 - auVar84._8_8_;
                    in_XMM10 = pblendvb(auVar63,auVar82,auVar47);
                    puVar3 = (ulong *)((long)*b + lVar34);
                    *puVar3 = uVar22;
                    puVar3[1] = uVar43;
                    uStack_b0 = (ulong)(uint)gap;
                    *(undefined1 (*) [16])((long)*b_00 + lVar34) = auVar79;
                    *(undefined1 (*) [16])((long)*b_01 + lVar34) = auVar70;
                    *(undefined1 (*) [16])((long)*b_02 + lVar34) = auVar82;
                    puVar3 = (ulong *)((long)*ptr + lVar34);
                    *puVar3 = uVar75;
                    puVar3[1] = uVar52;
                    *(undefined1 (*) [16])((long)*b_03 + lVar34) = auVar85;
                    *(undefined1 (*) [16])((long)*b_04 + lVar34) = auVar90;
                    *(undefined1 (*) [16])((long)*b_05 + lVar34) = auVar63;
                    lVar34 = lVar34 + 0x10;
                    local_188 = auVar5._0_8_;
                    lStack_180 = auVar5._8_8_;
                    local_218 = auVar76._0_8_;
                    lStack_210 = auVar76._8_8_;
                    local_208._0_8_ = auVar71._0_8_;
                    local_208._8_8_ = auVar71._8_8_;
                    uVar75 = uVar42;
                    lStack_190 = lVar36;
                    iVar74 = lVar12;
                    lVar53 = lVar15;
                  } while (lVar61 != lVar34);
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = auVar88._0_8_;
                  local_208 = auVar79 << 0x40;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_248._0_8_;
                  local_248 = auVar5 << 0x40;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = in_XMM10._0_8_;
                  in_XMM10 = auVar70 << 0x40;
                  uVar75 = ptr_06[uVar38 + 1];
                  uVar43 = uVar75 + (*ptr_04)[0];
                  lVar53 = uVar54 + (*ptr_04)[1];
                  uVar59 = uVar38 + 1;
                  auVar64._8_8_ = -(ulong)(lVar36 < lVar53);
                  auVar64._0_8_ = -(ulong)((long)uVar42 < (long)uVar43);
                  auVar48._0_8_ = -(ulong)(uVar43 == uVar42);
                  auVar48._8_8_ = -(ulong)(lVar53 == lVar36);
                  auVar48 = auVar48 | auVar64;
                  auVar71 = pblendvb(local_238,local_208,auVar48);
                  auVar88 = pblendvb(local_228,local_248,auVar48);
                  auVar46 = pblendvb(auVar46,(undefined1  [16])*ptr_05,auVar48);
                  if ((long)uVar43 < (long)uVar42) {
                    uVar43 = uVar42;
                  }
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = auVar71._0_8_;
                  auVar89 = auVar89 << 0x40;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = auVar88._0_8_;
                  auVar87 = auVar87 << 0x40;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = auVar46._0_8_;
                  auVar86 = auVar16 << 0x40;
                  uVar42 = uVar54;
                  if ((long)uVar54 < (long)uVar43) {
                    uVar42 = uVar43;
                  }
                  uVar52 = uVar75;
                  if ((long)uVar75 < (long)uVar1) {
                    uVar52 = uVar1;
                  }
                  auVar49._8_8_ = -(ulong)((long)uVar54 < (long)uVar43);
                  auVar49._0_8_ = -(ulong)((long)uVar75 < (long)uVar1);
                  auVar46 = pblendvb(local_208,auVar89,auVar49);
                  auVar71 = pblendvb(local_248,auVar87,auVar49);
                  auVar88 = pblendvb(in_XMM10,auVar86,auVar49);
                  lVar34 = 0;
                  lVar53 = lVar25;
                  lVar26 = lVar68;
                  uVar54 = uVar1;
                  do {
                    uVar75 = uVar52 - (uint)open;
                    uVar42 = uVar42 - (uint)open;
                    uVar69 = uVar54 - uVar41;
                    uVar73 = uVar43 - uStack_b0;
                    uVar54 = uVar69;
                    if ((long)uVar69 < (long)uVar75) {
                      uVar54 = uVar75;
                    }
                    uVar43 = uVar73;
                    if ((long)uVar73 < (long)uVar42) {
                      uVar43 = uVar42;
                    }
                    uVar22 = *(ulong *)((long)*ptr + lVar34);
                    uVar11 = *(ulong *)((long)*ptr + lVar34 + 8);
                    uVar52 = *(ulong *)((long)*b + lVar34);
                    if ((long)uVar52 < (long)uVar22) {
                      uVar52 = uVar22;
                    }
                    auVar50._8_8_ = -(ulong)((long)uVar73 < (long)uVar42);
                    auVar50._0_8_ = -(ulong)((long)uVar69 < (long)uVar75);
                    uVar42 = *(ulong *)((long)*b + lVar34 + 8);
                    auVar89 = pblendvb(auVar89,auVar46,auVar50);
                    if ((long)uVar42 < (long)uVar11) {
                      uVar42 = uVar11;
                    }
                    auVar87 = pblendvb(auVar87,auVar71,auVar50);
                    auVar88 = pblendvb(auVar86,auVar88,auVar50);
                    if ((long)uVar52 <= (long)uVar54) {
                      uVar52 = uVar54;
                    }
                    if ((long)uVar42 <= (long)uVar43) {
                      uVar42 = uVar43;
                    }
                    puVar3 = (ulong *)((long)*ptr + lVar34);
                    auVar57._0_8_ = -(ulong)(*puVar3 == uVar52);
                    auVar57._8_8_ = -(ulong)(puVar3[1] == uVar42);
                    auVar65._0_8_ = -(ulong)(uVar52 == uVar54);
                    auVar65._8_8_ = -(ulong)(uVar42 == uVar43);
                    auVar46 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar34),auVar89,auVar65)
                    ;
                    auVar46 = blendvpd(auVar46,*(undefined1 (*) [16])((long)*b_03 + lVar34),auVar57)
                    ;
                    auVar71 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar34),auVar87,auVar65)
                    ;
                    auVar71 = blendvpd(auVar71,*(undefined1 (*) [16])((long)*b_04 + lVar34),auVar57)
                    ;
                    auVar86._0_8_ = auVar88._0_8_ + 1;
                    auVar86._8_8_ = auVar88._8_8_ + 1;
                    auVar88 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar34),auVar86,auVar65)
                    ;
                    auVar88 = blendvpd(auVar88,*(undefined1 (*) [16])((long)*b_05 + lVar34),auVar57)
                    ;
                    puVar3 = (ulong *)((long)*ptr + lVar34);
                    *puVar3 = uVar52;
                    puVar3[1] = uVar42;
                    *(undefined1 (*) [16])((long)*b_03 + lVar34) = auVar46;
                    *(undefined1 (*) [16])((long)*b_04 + lVar34) = auVar71;
                    *(undefined1 (*) [16])((long)*b_05 + lVar34) = auVar88;
                    lVar12 = *((ppVar21->field_4).trace)->trace_del_table;
                    *(int *)(lVar12 + lVar26) = (int)uVar52;
                    *(int *)(lVar12 + lVar53) = (int)uVar42;
                    lVar12 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar12 + lVar26) = auVar46._0_4_;
                    uVar13 = extractps(auVar46,2);
                    *(undefined8 *)(lVar12 + lVar53) = uVar13;
                    if ((long)uVar52 <= (long)local_c8._0_8_) {
                      local_c8._0_8_ = uVar52;
                    }
                    if ((long)uVar42 <= (long)local_c8._8_8_) {
                      local_c8._8_8_ = uVar42;
                    }
                    if ((long)local_d8._0_8_ <= (long)uVar52) {
                      local_d8._0_8_ = uVar52;
                    }
                    lVar12 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar12 + lVar26) = auVar71._0_4_;
                    uVar13 = extractps(auVar71,2);
                    *(undefined8 *)(lVar12 + lVar53) = uVar13;
                    if ((long)local_d8._8_8_ <= (long)uVar42) {
                      local_d8._8_8_ = uVar42;
                    }
                    if ((long)local_d8._0_8_ <= (long)auVar46._0_8_) {
                      local_d8._0_8_ = auVar46._0_8_;
                    }
                    if ((long)local_d8._8_8_ <= (long)auVar46._8_8_) {
                      local_d8._8_8_ = auVar46._8_8_;
                    }
                    if ((long)local_d8._0_8_ <= (long)auVar71._0_8_) {
                      local_d8._0_8_ = auVar71._0_8_;
                    }
                    lVar12 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar12 + lVar26) = auVar88._0_4_;
                    uVar13 = extractps(auVar88,2);
                    *(undefined8 *)(lVar12 + lVar53) = uVar13;
                    if ((long)local_d8._8_8_ <= (long)auVar71._8_8_) {
                      local_d8._8_8_ = auVar71._8_8_;
                    }
                    if ((long)local_d8._0_8_ <= (long)auVar88._0_8_) {
                      local_d8._0_8_ = auVar88._0_8_;
                    }
                    if ((long)local_d8._8_8_ <= (long)auVar88._8_8_) {
                      local_d8._8_8_ = auVar88._8_8_;
                    }
                    lVar34 = lVar34 + 0x10;
                    lVar53 = lVar53 + uVar31 * 4;
                    lVar26 = lVar26 + uVar31 * 4;
                  } while (lVar61 != lVar34);
                  local_88 = auVar78._0_8_;
                  uStack_80 = auVar78._8_8_;
                  lVar53 = ptr[uVar27][0];
                  uVar54 = ptr[uVar27][1];
                  lVar26 = lVar53;
                  if (lVar53 < local_88) {
                    lVar26 = local_88;
                  }
                  local_2c8 = uVar54;
                  if ((long)uVar54 < (long)uStack_80) {
                    local_2c8 = uStack_80;
                  }
                  auVar51._8_8_ = -(ulong)((long)uStack_80 < (long)uVar54);
                  auVar51._0_8_ = -(ulong)(local_88 < lVar53);
                  auVar77 = pblendvb(auVar77,(undefined1  [16])b_03[uVar27],auVar51);
                  uVar54 = auVar77._8_8_;
                  auVar72 = pblendvb(auVar72,(undefined1  [16])b_04[uVar27],auVar51);
                  uVar75 = auVar72._8_8_;
                  auVar66 = pblendvb(auVar66,(undefined1  [16])b_05[uVar27],auVar51);
                  uVar43 = auVar66._8_8_;
                  auVar51 = auVar51 & local_1a8;
                  auVar78._8_8_ = local_2c8;
                  auVar78._0_8_ = lVar26;
                  local_1c0 = (int)uVar38;
                  if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar51 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar51 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar51 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar51 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar51 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar51 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar51 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar51 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar51[0xf] < '\0') {
                    iVar39 = local_1c0;
                  }
                  lVar25 = lVar25 + 4;
                  lVar68 = lVar68 + 4;
                  uVar38 = uVar59;
                } while (uVar59 != uVar33);
                if (s2_end == 0) {
                  uVar54 = 0;
                  uVar75 = 0;
                  uVar43 = 0;
                  local_2c8 = uVar1;
                }
                else if (iVar17 < 1) {
                  do {
                    local_2c8 = auVar78._0_8_;
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = local_2c8;
                    auVar78 = auVar14 << 0x40;
                    uVar54 = auVar77._0_8_;
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar54;
                    auVar77 = auVar77 << 0x40;
                    uVar75 = auVar72._0_8_;
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = uVar75;
                    auVar72 = auVar72 << 0x40;
                    uVar43 = auVar66._0_8_;
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar43;
                    auVar66 = auVar66 << 0x40;
                  } while (iVar17 < 0);
                }
                iVar32 = (int)uVar43;
                iVar19 = (int)uVar75;
                iVar23 = (int)uVar54;
                iVar24 = iVar30;
                if ((s1_end != 0) && ((uVar29 & 0x7ffffffe) != 0)) {
                  uVar31 = 0;
                  do {
                    uVar20 = 0;
                    if ((uVar31 & 1) != 0) {
                      uVar20 = uVar37;
                    }
                    iVar23 = uVar20 + ((uint)(uVar31 >> 1) & 0x7fffffff);
                    if (iVar23 < (int)uVar6) {
                      uVar29 = (*ptr)[uVar31];
                      iVar19 = iVar18;
                      if (((long)local_2c8 < (long)uVar29) ||
                         (((uVar29 == local_2c8 && (iVar39 == iVar18)) &&
                          (uVar29 = local_2c8, iVar19 = iVar39, iVar23 < iVar24)))) {
                        iVar39 = iVar19;
                        uVar54 = (*b_03)[uVar31];
                        uVar75 = (*b_04)[uVar31];
                        uVar43 = (*b_05)[uVar31];
                        iVar24 = iVar23;
                        local_2c8 = uVar29;
                      }
                    }
                    iVar32 = (int)uVar43;
                    iVar19 = (int)uVar75;
                    iVar23 = (int)uVar54;
                    uVar31 = uVar31 + 1;
                  } while ((uVar37 & 0x3fffffff) * 2 != (int)uVar31);
                }
                if (s2_end == 0 && s1_end == 0) {
                  lVar35 = ptr[uVar27][0];
                  local_2c8._0_4_ = (int)ptr[uVar27][1];
                  lVar62 = b_03[uVar27][0];
                  iVar23 = (int)b_03[uVar27][1];
                  lVar55 = b_04[uVar27][0];
                  iVar19 = (int)b_04[uVar27][1];
                  lVar44 = b_05[uVar27][0];
                  iVar32 = (int)b_05[uVar27][1];
                  iVar39 = iVar18;
                  iVar24 = iVar30;
                  if (iVar17 < 1) {
                    do {
                      local_2c8._0_4_ = (int)lVar35;
                      iVar32 = (int)lVar44;
                      iVar19 = (int)lVar55;
                      iVar23 = (int)lVar62;
                      lVar35 = 0;
                      lVar62 = 0;
                      lVar55 = 0;
                      lVar44 = 0;
                    } while (iVar17 < 0);
                  }
                }
                auVar58._8_8_ = -(ulong)((long)local_c8._8_8_ <= (long)uVar40);
                auVar58._0_8_ = -(ulong)((long)local_c8._0_8_ <= (long)uVar40);
                auVar67._8_8_ = -(ulong)((long)len < (long)local_d8._8_8_);
                auVar67._0_8_ = -(ulong)((long)len < (long)local_d8._0_8_);
                auVar67 = auVar67 | auVar58;
                if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar67 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar67[0xf] < '\0') {
                  *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                  local_2c8._0_4_ = 0;
                  iVar23 = 0;
                  iVar19 = 0;
                  iVar32 = 0;
                  iVar39 = 0;
                  iVar24 = 0;
                }
                ppVar21->score = (int)local_2c8;
                ppVar21->end_query = iVar24;
                ppVar21->end_ref = iVar39;
                ((ppVar21->field_4).stats)->matches = iVar23;
                ((ppVar21->field_4).stats)->similar = iVar19;
                ((ppVar21->field_4).stats)->length = iVar32;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar21;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxM = _mm_slli_si128(vMaxM, 8);
            vMaxS = _mm_slli_si128(vMaxS, 8);
            vMaxL = _mm_slli_si128(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}